

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O0

void __thiscall LTChannel::Stop(LTChannel *this,bool bWaitJoin)

{
  bool bVar1;
  byte in_SIL;
  thread *in_RDI;
  thread *in_stack_ffffffffffffffd8;
  undefined1 local_18 [15];
  byte local_9;
  
  local_9 = in_SIL & 1;
  bVar1 = isRunning((LTChannel *)0x1c38b1);
  if (bVar1) {
    if ((int)in_RDI[0x11]._M_id._M_thread < 3) {
      *(undefined4 *)&in_RDI[0x11]._M_id._M_thread = 3;
    }
    if ((local_9 & 1) != 0) {
      std::thread::join();
      memset(local_18,0,8);
      std::thread::thread((thread *)0x1c3906);
      std::thread::operator=(in_RDI,in_stack_ffffffffffffffd8);
      std::thread::~thread((thread *)0x1c3923);
      *(undefined4 *)&in_RDI[0x11]._M_id._M_thread = 0;
    }
  }
  return;
}

Assistant:

void LTChannel::Stop (bool bWaitJoin)
{
    if (isRunning()) {
        if (eThrStatus < THR_STOP)
            eThrStatus = THR_STOP;          // indicate to the thread that it has to end itself
        if (bWaitJoin) {
            thr.join();                     // wait for the thread to actually end
            thr = std::thread();
            eThrStatus = THR_NONE;
        }
    }
}